

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O2

result_t * sequenceFunc(result_t *__return_storage_ptr__,Env *env,shared_ptr<SpadeArguments> *args)

{
  ostringstream *poVar1;
  element_type *peVar2;
  result_t *prVar3;
  int iVar4;
  reference pvVar5;
  ostream *poVar6;
  __shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2> *ctx;
  __shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> *ctx_00;
  ulong __n;
  shared_ptr<InvertDatabase> invdb;
  shared_ptr<Partition> partition;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> numLargeItemset;
  shared_ptr<ClassInfo> cls;
  result_t *result;
  Sequence sequence;
  undefined1 local_140 [16];
  __shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> local_110;
  result_t *local_100;
  string local_f8 [32];
  Sequence local_d8;
  
  local_d8.args.super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.args.super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.partition.super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.partition.super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.cls.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.cls.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.invdb.super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.invdb.super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.l_array.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.l_array.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.e_array.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.e_array.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.m_array.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.m_array.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.FreqArray.
  super___shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_d8.FreqArray.
  super___shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.FreqArraySz = 100;
  local_d8.FreqArrayPos = 0;
  local_d8.numLargeItemset.
  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.numLargeItemset.
  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_100 = __return_storage_ptr__;
  local_d8.env = env;
  std::make_shared<std::vector<int,std::allocator<int>>>();
  std::make_shared<ClassInfo>();
  std::make_shared<Partition>();
  std::make_shared<InvertDatabase,Env&>((Env *)local_140);
  std::__shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_d8.args.super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>,
             &args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_d8.cls.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>,&local_110);
  std::__shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_d8.invdb.super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2> *)local_140);
  std::__shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_d8.partition.super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>,
             &local_130);
  std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_d8.numLargeItemset.
              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
             ,&local_120);
  ClassInfo::setArgs(local_110._M_ptr,args);
  Partition::set_args(local_130._M_ptr,args);
  InvertDatabase::set_cls((InvertDatabase *)local_140._0_8_,(shared_ptr<ClassInfo> *)&local_110);
  InvertDatabase::setArgs((InvertDatabase *)local_140._0_8_,args);
  ctx = &local_130;
  InvertDatabase::setPartition((InvertDatabase *)local_140._0_8_,(shared_ptr<Partition> *)ctx);
  ClassInfo::init(local_110._M_ptr,(EVP_PKEY_CTX *)ctx);
  peVar2 = (args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar4 = peVar2->num_partitions;
  InvertDatabase::init
            ((InvertDatabase *)local_140._0_8_,
             (EVP_PKEY_CTX *)(ulong)(uint)(iVar4 + (iVar4 + peVar2->total_trans_count + -1) / iVar4)
            );
  ctx_00 = &local_120;
  std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_d8.numLargeItemset.
              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
             ,ctx_00);
  Partition::init(local_130._M_ptr,(EVP_PKEY_CTX *)ctx_00);
  Partition::partition_alloc(local_130._M_ptr);
  Sequence::read_files(&local_d8);
  if (((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->use_maxgap !=
      '\0') {
    iVar4 = ClassInfo::get_num_class(local_110._M_ptr);
    pvVar5 = std::vector<int,_std::allocator<int>_>::at(local_120._M_ptr,0);
    InvertDatabase::init_buffer((InvertDatabase *)local_140._0_8_,iVar4,*pvVar5);
  }
  Sequence::newSeq(&local_d8);
  poVar1 = &env->summary;
  std::operator<<((ostream *)poVar1,"SPADE");
  if (((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->use_hash != 0
     ) {
    std::operator<<((ostream *)poVar1," USEHASH");
  }
  poVar6 = std::operator<<((ostream *)poVar1," ");
  poVar6 = std::operator<<(poVar6,(string *)
                                  &((args->
                                    super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr)->dataf);
  std::operator<<(poVar6," ");
  poVar6 = std::ostream::_M_insert<double>
                     (((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->min_support_per_class);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar6,
                      ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->min_support);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar6,
                      ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->num_intersect);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar6,
                      ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->pruning_type);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar6,
                      ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->L2pruning);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar6,
                      ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->prepruning);
  poVar6 = std::operator<<(poVar6," ");
  std::ostream::operator<<
            ((ostream *)poVar6,
             ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             postpruning);
  if (((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->use_window ==
      '\0') {
    std::operator<<((ostream *)poVar1," 0");
    poVar6 = (ostream *)poVar1;
    if (((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->use_maxgap
        == '\0') {
      std::operator<<((ostream *)poVar1," -1");
      goto LAB_0010a97f;
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)poVar1," ");
    poVar6 = std::operator<<(poVar6,((args->
                                     super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)
                                    ._M_ptr)->use_window);
  }
  poVar6 = std::operator<<(poVar6," ");
  std::ostream::operator<<
            ((ostream *)poVar6,
             ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             max_gap);
LAB_0010a97f:
  poVar6 = std::operator<<((ostream *)poVar1," ");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar6,
                      ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->min_gap);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar6,
                      ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->max_iset_len);
  poVar6 = std::operator<<(poVar6," ");
  std::ostream::operator<<
            ((ostream *)poVar6,
             ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             max_seq_len);
  for (__n = 0; __n < (ulong)((long)((local_120._M_ptr)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)((local_120._M_ptr)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start >> 2); __n = __n + 1) {
    poVar6 = std::operator<<((ostream *)poVar1," ");
    pvVar5 = std::vector<int,_std::allocator<int>_>::at(local_120._M_ptr,__n);
    std::ostream::operator<<((ostream *)poVar6,*pvVar5);
  }
  std::endl<char,std::char_traits<char>>((ostream *)poVar1);
  prVar3 = local_100;
  result_t::result_t(local_100);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&prVar3->summary,local_f8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&prVar3->logger,local_f8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&prVar3->seqstrm,local_f8);
  std::__cxx11::string::~string(local_f8);
  prVar3->nsequences =
       ((args->super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       total_trans_count;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_140 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  Sequence::~Sequence(&local_d8);
  return prVar3;
}

Assistant:

result_t sequenceFunc(Env& env, const shared_ptr<SpadeArguments>& args) {
    Sequence sequence(env);
    shared_ptr<vint> numLargeItemset = make_shared<vint>();
    shared_ptr<ClassInfo> cls = make_shared<ClassInfo>();
    shared_ptr<Partition> partition = make_shared<Partition>();
    shared_ptr<InvertDatabase> invdb = make_shared<InvertDatabase>(env);
//    shared_ptr<ItemBufferManager> ibm = make_shared<ItemBufferManager>();

    sequence.set_args(args);
//    sequence.set_ibm(ibm);
    sequence.set_cls(cls);
    sequence.set_invdb(invdb);
    sequence.set_partition(partition);
    sequence.set_num_large_dataset(numLargeItemset);

    cls->setArgs(args);

    partition->set_args(args);

    invdb->set_cls(cls);
    invdb->setArgs(args);
    invdb->setPartition(partition);

    ostringstream &summary = env.summary;
    ostringstream &logger = env.logger;
    ostringstream &seqstrm = env.seqstrm;

    cls->init();

    int external_block_size =
            args->num_partitions + (args->total_trans_count + args->num_partitions - 1) / args->num_partitions;
    invdb->init(external_block_size);
    sequence.set_num_large_dataset(numLargeItemset);

    partition->init();
    partition->partition_alloc();

    int i;
    sequence.read_files();

    if (args->use_maxgap) {
        invdb->init_buffer(cls->get_num_class(), numLargeItemset->at(0));
    }

    sequence.newSeq();

    summary << "SPADE";

    if (args->use_hash) {
        summary << " USEHASH";
    }
    summary << " " << args->dataf << " " << args->min_support_per_class << " " << args->min_support << " "
            << args->num_intersect << " " << args->pruning_type << " " << args->L2pruning << " " << args->prepruning
            << " " << args->postpruning;
    if (args->use_window) {
        summary << " " << args->use_window << " " << args->max_gap;
    } else {
        summary << " 0";
        if (args->use_maxgap) {
            summary << " " << args->max_gap;
        } else {
            summary << " -1";
        }
    }

    summary << " " << args->min_gap << " " << args->max_iset_len << " " << args->max_seq_len;

    for (i = 0; i < numLargeItemset->size(); i++) {
        summary << " " << numLargeItemset->at(i);
    }
    summary << endl;
    result_t result;
    result.summary = summary.str();
    result.logger = logger.str();
    result.seqstrm = seqstrm.str();
    result.nsequences = args->total_trans_count;

    return result;
}